

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseStringConcat(Parser *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  runtime_error *prVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar6;
  Parser *in_stack_00000018;
  shared_ptr<minja::Expression> right;
  shared_ptr<minja::Expression> *left;
  shared_ptr<minja::BinaryOpExpr> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  element_type *this_00;
  uint in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  flag_type in_stack_ffffffffffffff84;
  Location *in_stack_ffffffffffffff88;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff90;
  Parser *in_stack_ffffffffffffff98;
  __shared_ptr local_58 [16];
  string local_48 [36];
  SpaceHandling in_stack_ffffffffffffffdc;
  regex *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar7;
  
  uVar7 = 0;
  this_00 = in_RDI;
  parseMathPow(in_stack_00000018);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
  if (!bVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Expected left side of \'string concat\' expression");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((parseStringConcat()::concat_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseStringConcat()::concat_tok_abi_cxx11_), iVar3 != 0)) {
    httplib::detail::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84
              );
    __cxa_atexit(httplib::detail::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>
                 ::~basic_regex,&parseStringConcat()::concat_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseStringConcat()::concat_tok_abi_cxx11_);
  }
  consumeToken((Parser *)CONCAT17(uVar7,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffdc);
  bVar2 = std::__cxx11::string::empty();
  bVar2 = bVar2 ^ 0xff;
  std::__cxx11::string::~string(local_48);
  _Var5._M_pi = extraout_RDX;
  if ((bVar2 & 1) != 0) {
    parseLogicalAnd((Parser *)CONCAT17(uVar7,in_stack_ffffffffffffffe8));
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_58);
    if (!bVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"Expected right side of \'string concat\' expression");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get_location(in_stack_ffffffffffffff98);
    std::
    make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op>
              (in_stack_ffffffffffffff88,
               (shared_ptr<minja::Expression> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (shared_ptr<minja::Expression> *)(ulong)in_stack_ffffffffffffff78,(Op *)this_00);
    std::shared_ptr<minja::Expression>::operator=
              ((shared_ptr<minja::Expression> *)CONCAT17(bVar2,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    std::shared_ptr<minja::BinaryOpExpr>::~shared_ptr((shared_ptr<minja::BinaryOpExpr> *)0x3c998c);
    Location::~Location((Location *)0x3c9996);
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x3c99a0);
    _Var5._M_pi = extraout_RDX_00;
  }
  sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::Expression>)
         sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseStringConcat() {
        auto left = parseMathPow();
        if (!left) throw std::runtime_error("Expected left side of 'string concat' expression");

        static std::regex concat_tok(R"(~(?!\}))");
        if (!consumeToken(concat_tok).empty()) {
            auto right = parseLogicalAnd();
            if (!right) throw std::runtime_error("Expected right side of 'string concat' expression");
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), BinaryOpExpr::Op::StrConcat);
        }
        return left;
    }